

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleString_copyInBufferNormal_Test::testBody(TEST_SimpleString_copyInBufferNormal_Test *this)

{
  size_t sVar1;
  char *bufferToCopy;
  UtestShell *pUVar2;
  char *pcVar3;
  TestTerminator *pTVar4;
  SimpleString str;
  SimpleString local_28;
  
  SimpleString::SimpleString(&local_28,"Hello World");
  sVar1 = SimpleString::size(&local_28);
  bufferToCopy = (char *)(*PlatformSpecificMalloc)(sVar1 + 1);
  SimpleString::copyToBuffer(&local_28,bufferToCopy,sVar1 + 1);
  pUVar2 = UtestShell::getCurrent();
  pcVar3 = SimpleString::asCharString(&local_28);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[9])
            (pUVar2,pcVar3,bufferToCopy,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x221,pTVar4);
  (*PlatformSpecificFree)(bufferToCopy);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

TEST(SimpleString, copyInBufferNormal)
{
    SimpleString str("Hello World");
    size_t bufferSize = str.size()+1;
    char* buffer = (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);
    STRCMP_EQUAL(str.asCharString(), buffer);
    PlatformSpecificFree(buffer);
}